

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlWriter::swap(XmlWriter *this,XmlWriter *other)

{
  bool bVar1;
  ostream *poVar2;
  
  bVar1 = this->m_tagIsOpen;
  this->m_tagIsOpen = other->m_tagIsOpen;
  other->m_tagIsOpen = bVar1;
  bVar1 = this->m_needsNewline;
  this->m_needsNewline = other->m_needsNewline;
  other->m_needsNewline = bVar1;
  std::
  _Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&this->m_tags,(_Vector_impl_data *)&other->m_tags);
  std::__cxx11::string::swap((string *)&this->m_indent);
  poVar2 = this->m_os;
  this->m_os = other->m_os;
  other->m_os = poVar2;
  return;
}

Assistant:

void swap( XmlWriter& other ) {
            std::swap( m_tagIsOpen, other.m_tagIsOpen );
            std::swap( m_needsNewline, other.m_needsNewline );
            std::swap( m_tags, other.m_tags );
            std::swap( m_indent, other.m_indent );
            std::swap( m_os, other.m_os );
        }